

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbisetb.cpp
# Opt level: O2

void __thiscall icu_63::RBBISetBuilder::~RBBISetBuilder(RBBISetBuilder *this)

{
  RangeDescriptor *pRVar1;
  void *in_RSI;
  RangeDescriptor *r;
  RangeDescriptor *this_00;
  
  this_00 = this->fRangeList;
  while (this_00 != (RangeDescriptor *)0x0) {
    pRVar1 = this_00->fNext;
    RangeDescriptor::~RangeDescriptor(this_00);
    UMemory::operator_delete((UMemory *)this_00,in_RSI);
    this_00 = pRVar1;
  }
  utrie2_close_63(this->fTrie);
  return;
}

Assistant:

RBBISetBuilder::~RBBISetBuilder()
{
    RangeDescriptor   *nextRangeDesc;

    // Walk through & delete the linked list of RangeDescriptors
    for (nextRangeDesc = fRangeList; nextRangeDesc!=NULL;) {
        RangeDescriptor *r = nextRangeDesc;
        nextRangeDesc      = r->fNext;
        delete r;
    }

    utrie2_close(fTrie);
}